

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expected.h
# Opt level: O3

void __thiscall
Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~Expected(Expected<std::vector<yaml::Value,_std::allocator<yaml::Value>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pVVar2;
  pointer pcVar3;
  pointer pVVar4;
  pointer *ppVVar5;
  
  if (this->has_value_ != true) {
    pVVar4 = (this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
             _M_impl.super__Vector_impl_data._M_start;
    ppVVar5 = &(this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    if (pVVar4 != (pointer)ppVVar5) {
      operator_delete(pVVar4,(ulong)((long)&(*ppVVar5)->type_ + 1));
      return;
    }
    return;
  }
  pVVar4 = (this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (pVVar4 != pVVar2) {
    do {
      std::vector<yaml::Value,_std::allocator<yaml::Value>_>::~vector(&pVVar4->sequence_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yaml::Value>_>_>
                   *)&pVVar4->mapping_);
      pcVar3 = (pVVar4->string_)._M_dataplus._M_p;
      paVar1 = &(pVVar4->string_).field_2;
      if (paVar1 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar3) {
        operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
      }
      pVVar4 = pVVar4 + 1;
    } while (pVVar4 != pVVar2);
    pVVar4 = (this->field_0).value_.super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  if (pVVar4 != (pointer)0x0) {
    operator_delete(pVVar4,(long)(this->field_0).value_.
                                 super__Vector_base<yaml::Value,_std::allocator<yaml::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pVVar4);
    return;
  }
  return;
}

Assistant:

~Expected() {
		if (has_value_)
			value_.~T();
		else
			error_.~UnexpectedType();
	}